

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

SRes Lzma2Dec_AllocateProbs(CLzma2Dec *p,Byte prop,ISzAlloc *alloc)

{
  SRes SVar1;
  ISzAlloc *in_RDX;
  Byte in_SIL;
  Byte *in_RDI;
  int __result__;
  Byte props [5];
  Byte local_25 [5];
  undefined3 in_stack_ffffffffffffffec;
  uint propsSize;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  propsSize = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  SVar1 = Lzma2Dec_GetOldProps(in_SIL,local_25);
  if (SVar1 == 0) {
    SVar1 = LzmaDec_AllocateProbs
                      ((CLzmaDec *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,propsSize,in_RDX);
  }
  return SVar1;
}

Assistant:

SRes Lzma2Dec_AllocateProbs(CLzma2Dec *p, Byte prop, ISzAlloc *alloc)
{
  Byte props[LZMA_PROPS_SIZE];
  RINOK(Lzma2Dec_GetOldProps(prop, props));
  return LzmaDec_AllocateProbs(&p->decoder, props, LZMA_PROPS_SIZE, alloc);
}